

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::verifyUniformMatrixValues<3>
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,
               GLfloat *values,bool transpose)

{
  ostringstream *this;
  int iVar1;
  bool bVar2;
  int iVar3;
  MessageBuilder *pMVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  GLfloat *value;
  StateQueryMemoryWriteGuard<float[9]> state;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[9]>::StateQueryMemoryWriteGuard
            (&state);
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,state.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[9]>::verifyValidity
                    (&state,testCtx);
  if (bVar2) {
    this = (ostringstream *)(local_1b0 + 8);
    iVar1 = 0;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      lVar6 = lVar5;
      value = values;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        iVar3 = iVar1 + (int)lVar7;
        if (transpose) {
          iVar3 = (int)lVar6;
        }
        if ((*value != state.m_value[iVar3]) || (NAN(*value) || NAN(state.m_value[iVar3]))) {
          local_1b0._0_8_ = testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(this);
          std::operator<<((ostream *)this,"// ERROR: at index [");
          std::ostream::operator<<(this,(int)lVar5);
          std::operator<<((ostream *)this,"][");
          std::ostream::operator<<(this,(int)lVar7);
          std::operator<<((ostream *)this,"] expected ");
          pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
          std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          "; got ");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,state.m_value + iVar3);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this);
          if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value")
            ;
          }
        }
        lVar6 = lVar6 + 3;
        value = value + 1;
      }
      iVar1 = iVar1 + 3;
      values = values + 3;
    }
  }
  return;
}

Assistant:

void verifyUniformMatrixValues (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, const GLfloat* values, bool transpose)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[N*N]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	for (int y = 0; y < N; ++y)
		for (int x = 0; x < N; ++x)
		{
			const int refIndex = y*N + x;
			const int stateIndex = transpose ? (x*N + y) : (y*N + x);

			if (values[refIndex] != state[stateIndex])
			{
				testCtx.getLog() << TestLog::Message << "// ERROR: at index [" << y << "][" << x << "] expected " << values[refIndex] << "; got " << state[stateIndex] << TestLog::EndMessage;

				if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
			}
		}
}